

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>,std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>,BLOCK_SIZE,int,int>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul>>::AdvanceIfEnd<3ul>
          (IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul>> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<int>::operator!=
                    ((ParamIterator<int> *)(this + 0x68),(ParamIterator<int> *)(this + 0x40));
  if (bVar1) {
    return;
  }
  ParamIterator<int>::operator=
            ((ParamIterator<int> *)(this + 0x68),(ParamIterator<int> *)(this + 0x18));
  (**(code **)(**(long **)(this + 0x70) + 0x18))();
  AdvanceIfEnd<2ul>(this);
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }